

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O1

object get_float_data(SRUP_MSG_DATA *self)

{
  float *pfVar1;
  PyObject *pPVar2;
  SRUP_MSG_DATA *in_RSI;
  
  pfVar1 = SRUP_MSG_DATA::data_float(in_RSI);
  if (pfVar1 == (float *)0x0) {
    pPVar2 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    pPVar2 = boost::python::api::object_initializer_impl<false,_false>::get<float>(pfVar1);
  }
  (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_float_data(SRUP_MSG_DATA& self)
{
    float* rv;
    rv = self.data_float();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();

}